

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::LayoutBindingTests::init(LayoutBindingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  TestCaseGroup *pTVar4;
  SamplerBindingRenderCase *pSVar5;
  char *pcVar6;
  char *pcVar7;
  ImageBindingRenderCase *pIVar8;
  UBOBindingRenderCase *this_00;
  SSBOBindingRenderCase *this_01;
  TestNode *node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  NegativeTestType *local_218;
  NegativeTestType *test_1;
  int testNdx_1;
  undefined1 local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  RenderTestType *local_120;
  RenderTestType *test;
  undefined1 local_10f;
  undefined1 local_10e;
  allocator<char> local_10d;
  int testNdx;
  undefined1 local_108;
  allocator<char> local_107;
  allocator<char> local_106;
  undefined1 local_105;
  allocator<char> local_104;
  allocator<char> local_103;
  undefined1 local_102;
  allocator<char> local_101;
  allocator<char> local_100;
  undefined1 local_ff;
  allocator<char> local_fe;
  allocator<char> local_fd;
  undefined1 local_fc;
  allocator<char> local_fb;
  allocator<char> local_fa;
  undefined1 local_f9;
  allocator<char> local_f8;
  allocator<char> local_f7;
  undefined1 local_f6;
  allocator<char> local_f5;
  allocator<char> local_f4;
  undefined1 local_f3;
  allocator<char> local_f2;
  allocator<char> local_f1;
  undefined1 local_f0;
  allocator<char> local_ef;
  allocator<char> local_ee;
  undefined1 local_ed;
  allocator<char> local_ec;
  allocator<char> local_eb;
  undefined1 local_ea;
  allocator<char> local_e9;
  allocator<char> local_e8;
  undefined1 local_e7;
  allocator<char> local_e6;
  allocator<char> local_e5;
  undefined1 local_e4;
  allocator<char> local_e3;
  allocator<char> local_e2;
  undefined1 local_e1;
  allocator<char> local_e0;
  allocator<char> local_df;
  undefined1 local_de;
  allocator<char> local_dd;
  allocator<char> local_dc;
  undefined1 local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  NegativeTestType *local_d8;
  undefined1 local_cf;
  undefined1 local_ce;
  allocator<char> local_cd;
  allocator<char> local_cc;
  undefined1 local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  undefined1 local_c8;
  allocator<char> local_c7;
  allocator<char> local_c6;
  undefined1 local_c5;
  allocator<char> local_c4;
  allocator<char> local_c3;
  undefined1 local_c2;
  allocator<char> local_c1;
  allocator<char> local_c0;
  undefined1 local_bf;
  allocator<char> local_be;
  allocator<char> local_bd;
  undefined1 local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  undefined1 local_b9;
  allocator<char> local_b8;
  allocator<char> local_b7;
  undefined1 local_b6;
  allocator<char> local_b5;
  allocator<char> local_b4;
  undefined1 local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  RenderTestType *local_b0;
  TestNode *local_a8;
  TestCaseGroup *negativeSSBOBindingTestGroup;
  TestCaseGroup *negativeUBOBindingTestGroup;
  TestCaseGroup *negativeImage3dBindingTestGroup;
  TestCaseGroup *negativeImage2dBindingTestGroup;
  TestCaseGroup *negativeImageBindingTestGroup;
  TestCaseGroup *negativeSampler3dBindingTestGroup;
  TestCaseGroup *negativeSampler2dBindingTestGroup;
  TestCaseGroup *negativeSamplerBindingTestGroup;
  TestCaseGroup *negativeBindingTestGroup;
  TestCaseGroup *SSBOBindingTestGroup;
  TestCaseGroup *UBOBindingTestGroup;
  TestCaseGroup *image3dBindingTestGroup;
  TestCaseGroup *image2dBindingTestGroup;
  TestCaseGroup *imageBindingTestGroup;
  TestCaseGroup *sampler3dBindingTestGroup;
  TestCaseGroup *sampler2dBindingTestGroup;
  TestNode *local_18;
  TestCaseGroup *samplerBindingTestGroup;
  LayoutBindingTests *this_local;
  
  samplerBindingTestGroup = (TestCaseGroup *)this;
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler",
             "Test sampler layout binding");
  local_18 = pTVar3;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "sampler2d","Test sampler2d layout binding");
  sampler3dBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "sampler3d","Test sampler3d layout binding");
  imageBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image"
             ,"Test image layout binding");
  image2dBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "image2d","Test image2d layout binding");
  image3dBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "image3d","Test image3d layout binding");
  UBOBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ubo",
             "Test UBO layout binding");
  SSBOBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ssbo",
             "Test SSBO layout binding");
  negativeBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "negative","Test layout binding with invalid bindings");
  negativeSamplerBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "sampler","Test sampler layout binding with invalid bindings");
  negativeSampler2dBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "sampler2d","Test sampler2d layout binding with invalid bindings");
  negativeSampler3dBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "sampler3d","Test sampler3d layout binding with invalid bindings");
  negativeImageBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image"
             ,"Test image layout binding with invalid bindings");
  negativeImage2dBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "image2d","Test image2d layout binding with invalid bindings");
  negativeImage3dBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "image3d","Test image3d layout binding with invalid bindings");
  negativeUBOBindingTestGroup = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ubo",
             "Test UBO layout binding with invalid bindings");
  negativeSSBOBindingTestGroup = pTVar4;
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ssbo",
             "Test SSBO layout binding with invalid bindings");
  local_a8 = pTVar3;
  if (init()::s_renderTestTypes == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::s_renderTestTypes);
    if (iVar2 != 0) {
      local_cf = 1;
      local_b0 = init::s_renderTestTypes;
      init::s_renderTestTypes[0].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[0].testType = TESTTYPE_BINDING_SINGLE;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[0].name,"vertex_binding_single",&local_b1);
      local_b3 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[0].descPostfix,"a single instance",&local_b2);
      local_b3 = 0;
      local_b0 = (RenderTestType *)0x33cf4f8;
      init::s_renderTestTypes[1].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[1].testType = TESTTYPE_BINDING_MAX;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[1].name,"vertex_binding_max",&local_b4);
      local_b6 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[1].descPostfix,"maximum binding point",&local_b5
                );
      local_b6 = 0;
      local_b0 = (RenderTestType *)0x33cf540;
      init::s_renderTestTypes[2].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[2].testType = TESTTYPE_BINDING_MULTIPLE;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[2].name,"vertex_binding_multiple",&local_b7);
      local_b9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[2].descPostfix,"multiple instances",&local_b8);
      local_b9 = 0;
      local_b0 = (RenderTestType *)0x33cf588;
      init::s_renderTestTypes[3].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[3].testType = TESTTYPE_BINDING_ARRAY;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[3].name,"vertex_binding_array",&local_ba);
      local_bc = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[3].descPostfix,"an array instance",&local_bb);
      local_bc = 0;
      local_b0 = (RenderTestType *)0x33cf5d0;
      init::s_renderTestTypes[4].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[4].testType = TESTTYPE_BINDING_MAX_ARRAY;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[4].name,"vertex_binding_max_array",&local_bd);
      local_bf = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[4].descPostfix,
                 "an array instance with maximum binding point",&local_be);
      local_bf = 0;
      local_b0 = (RenderTestType *)0x33cf618;
      init::s_renderTestTypes[5].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[5].testType = TESTTYPE_BINDING_SINGLE;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[5].name,"fragment_binding_single",&local_c0);
      local_c2 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[5].descPostfix,"a single instance",&local_c1);
      local_c2 = 0;
      local_b0 = (RenderTestType *)0x33cf660;
      init::s_renderTestTypes[6].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[6].testType = TESTTYPE_BINDING_MAX;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[6].name,"fragment_binding_max",&local_c3);
      local_c5 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[6].descPostfix,"maximum binding point",&local_c4
                );
      local_c5 = 0;
      local_b0 = (RenderTestType *)0x33cf6a8;
      init::s_renderTestTypes[7].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[7].testType = TESTTYPE_BINDING_MULTIPLE;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[7].name,"fragment_binding_multiple",&local_c6);
      local_c8 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[7].descPostfix,"multiple instances",&local_c7);
      local_c8 = 0;
      local_b0 = (RenderTestType *)0x33cf6f0;
      init::s_renderTestTypes[8].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[8].testType = TESTTYPE_BINDING_ARRAY;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[8].name,"fragment_binding_array",&local_c9);
      local_cb = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[8].descPostfix,"an array instance",&local_ca);
      local_cb = 0;
      local_b0 = (RenderTestType *)0x33cf738;
      init::s_renderTestTypes[9].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[9].testType = TESTTYPE_BINDING_MAX_ARRAY;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[9].name,"fragment_binding_max_array",&local_cc);
      local_ce = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_renderTestTypes[9].descPostfix,
                 "an array instance with maximum binding point",&local_cd);
      local_ce = 0;
      local_cf = 0;
      std::allocator<char>::~allocator(&local_cd);
      std::allocator<char>::~allocator(&local_cc);
      std::allocator<char>::~allocator(&local_ca);
      std::allocator<char>::~allocator(&local_c9);
      std::allocator<char>::~allocator(&local_c7);
      std::allocator<char>::~allocator(&local_c6);
      std::allocator<char>::~allocator(&local_c4);
      std::allocator<char>::~allocator(&local_c3);
      std::allocator<char>::~allocator(&local_c1);
      std::allocator<char>::~allocator(&local_c0);
      std::allocator<char>::~allocator(&local_be);
      std::allocator<char>::~allocator(&local_bd);
      std::allocator<char>::~allocator(&local_bb);
      std::allocator<char>::~allocator(&local_ba);
      std::allocator<char>::~allocator(&local_b8);
      std::allocator<char>::~allocator(&local_b7);
      std::allocator<char>::~allocator(&local_b5);
      std::allocator<char>::~allocator(&local_b4);
      std::allocator<char>::~allocator(&local_b2);
      std::allocator<char>::~allocator(&local_b1);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&init()::s_renderTestTypes);
    }
  }
  if (init()::s_negativeTestTypes == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::s_negativeTestTypes);
    if (iVar2 != 0) {
      local_10f = 1;
      local_d8 = init::s_negativeTestTypes;
      init::s_negativeTestTypes[0].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[0].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[0].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0].name,"vertex_binding_over_max",&local_d9);
      local_db = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0].descPostfix,"over maximum binding point",
                 &local_da);
      local_db = 0;
      local_d8 = (NegativeTestType *)0x33cf7e0;
      init::s_negativeTestTypes[1].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[1].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[1].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[1].name,"fragment_binding_over_max",&local_dc)
      ;
      local_de = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[1].descPostfix,"over maximum binding point",
                 &local_dd);
      local_de = 0;
      local_d8 = (NegativeTestType *)0x33cf830;
      init::s_negativeTestTypes[2].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[2].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[2].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[2].name,"tess_control_binding_over_max",
                 &local_df);
      local_e1 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[2].descPostfix,"over maximum binding point",
                 &local_e0);
      local_e1 = 0;
      local_d8 = (NegativeTestType *)0x33cf880;
      init::s_negativeTestTypes[3].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[3].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[3].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[3].name,"tess_evaluation_binding_over_max",
                 &local_e2);
      local_e4 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[3].descPostfix,"over maximum binding point",
                 &local_e3);
      local_e4 = 0;
      local_d8 = (NegativeTestType *)0x33cf8d0;
      init::s_negativeTestTypes[4].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[4].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[4].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[4].name,"vertex_binding_neg",&local_e5);
      local_e7 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[4].descPostfix,"negative binding point",
                 &local_e6);
      local_e7 = 0;
      local_d8 = (NegativeTestType *)0x33cf920;
      init::s_negativeTestTypes[5].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[5].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[5].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[5].name,"fragment_binding_neg",&local_e8);
      local_ea = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[5].descPostfix,"negative binding point",
                 &local_e9);
      local_ea = 0;
      local_d8 = (NegativeTestType *)0x33cf970;
      init::s_negativeTestTypes[6].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[6].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[6].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[6].name,"tess_control_binding_neg",&local_eb);
      local_ed = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[6].descPostfix,"negative binding point",
                 &local_ec);
      local_ed = 0;
      local_d8 = (NegativeTestType *)0x33cf9c0;
      init::s_negativeTestTypes[7].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[7].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[7].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[7].name,"tess_evaluation_binding_neg",
                 &local_ee);
      local_f0 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[7].descPostfix,"negative binding point",
                 &local_ef);
      local_f0 = 0;
      local_d8 = (NegativeTestType *)0x33cfa10;
      init::s_negativeTestTypes[8].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[8].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[8].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[8].name,"vertex_binding_over_max_array",
                 &local_f1);
      local_f3 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[8].descPostfix,"over maximum binding point",
                 &local_f2);
      local_f3 = 0;
      local_d8 = (NegativeTestType *)0x33cfa60;
      init::s_negativeTestTypes[9].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[9].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[9].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[9].name,"fragment_binding_over_max_array",
                 &local_f4);
      local_f6 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[9].descPostfix,"over maximum binding point",
                 &local_f5);
      local_f6 = 0;
      local_d8 = (NegativeTestType *)0x33cfab0;
      init::s_negativeTestTypes[10].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[10].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[10].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[10].name,"tess_control_binding_over_max_array"
                 ,&local_f7);
      local_f9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[10].descPostfix,"over maximum binding point",
                 &local_f8);
      local_f9 = 0;
      local_d8 = (NegativeTestType *)0x33cfb00;
      init::s_negativeTestTypes[0xb].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[0xb].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xb].errorType = ERRORTYPE_OVER_MAX_UNITS;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xb].name,
                 "tess_evaluation_binding_over_max_array",&local_fa);
      local_fc = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xb].descPostfix,"over maximum binding point",
                 &local_fb);
      local_fc = 0;
      local_d8 = (NegativeTestType *)0x33cfb50;
      init::s_negativeTestTypes[0xc].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[0xc].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xc].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xc].name,"vertex_binding_neg_array",&local_fd
                );
      local_ff = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xc].descPostfix,"negative binding point",
                 &local_fe);
      local_ff = 0;
      local_d8 = (NegativeTestType *)0x33cfba0;
      init::s_negativeTestTypes[0xd].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[0xd].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xd].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xd].name,"fragment_binding_neg_array",
                 &local_100);
      local_102 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xd].descPostfix,"negative binding point",
                 &local_101);
      local_102 = 0;
      local_d8 = (NegativeTestType *)0x33cfbf0;
      init::s_negativeTestTypes[0xe].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[0xe].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xe].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xe].name,"tess_control_binding_neg_array",
                 &local_103);
      local_105 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xe].descPostfix,"negative binding point",
                 &local_104);
      local_105 = 0;
      local_d8 = (NegativeTestType *)0x33cfc40;
      init::s_negativeTestTypes[0xf].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[0xf].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xf].errorType = ERRORTYPE_LESS_THAN_ZERO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xf].name,"tess_evaluation_binding_neg_array",
                 &local_106);
      local_108 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0xf].descPostfix,"negative binding point",
                 &local_107);
      local_108 = 0;
      local_d8 = (NegativeTestType *)0x33cfc90;
      init::s_negativeTestTypes[0x10].shaderType = SHADERTYPE_ALL;
      init::s_negativeTestTypes[0x10].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[0x10].errorType = ERRORTYPE_CONTRADICTORY;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0x10].name,"binding_contradictory",
                 (allocator<char> *)((long)&testNdx + 3));
      testNdx._1_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0x10].descPostfix,
                 "contradictory binding points",(allocator<char> *)((long)&testNdx + 2));
      testNdx._1_1_ = 0;
      local_d8 = (NegativeTestType *)0x33cfce0;
      init::s_negativeTestTypes[0x11].shaderType = SHADERTYPE_ALL;
      init::s_negativeTestTypes[0x11].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0x11].errorType = ERRORTYPE_CONTRADICTORY;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0x11].name,"binding_contradictory_array",
                 (allocator<char> *)&testNdx);
      local_10e = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init::s_negativeTestTypes[0x11].descPostfix,
                 "contradictory binding points",&local_10d);
      local_10e = 0;
      local_10f = 0;
      std::allocator<char>::~allocator(&local_10d);
      std::allocator<char>::~allocator((allocator<char> *)&testNdx);
      std::allocator<char>::~allocator((allocator<char> *)((long)&testNdx + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)&testNdx + 3));
      std::allocator<char>::~allocator(&local_107);
      std::allocator<char>::~allocator(&local_106);
      std::allocator<char>::~allocator(&local_104);
      std::allocator<char>::~allocator(&local_103);
      std::allocator<char>::~allocator(&local_101);
      std::allocator<char>::~allocator(&local_100);
      std::allocator<char>::~allocator(&local_fe);
      std::allocator<char>::~allocator(&local_fd);
      std::allocator<char>::~allocator(&local_fb);
      std::allocator<char>::~allocator(&local_fa);
      std::allocator<char>::~allocator(&local_f8);
      std::allocator<char>::~allocator(&local_f7);
      std::allocator<char>::~allocator(&local_f5);
      std::allocator<char>::~allocator(&local_f4);
      std::allocator<char>::~allocator(&local_f2);
      std::allocator<char>::~allocator(&local_f1);
      std::allocator<char>::~allocator(&local_ef);
      std::allocator<char>::~allocator(&local_ee);
      std::allocator<char>::~allocator(&local_ec);
      std::allocator<char>::~allocator(&local_eb);
      std::allocator<char>::~allocator(&local_e9);
      std::allocator<char>::~allocator(&local_e8);
      std::allocator<char>::~allocator(&local_e6);
      std::allocator<char>::~allocator(&local_e5);
      std::allocator<char>::~allocator(&local_e3);
      std::allocator<char>::~allocator(&local_e2);
      std::allocator<char>::~allocator(&local_e0);
      std::allocator<char>::~allocator(&local_df);
      std::allocator<char>::~allocator(&local_dd);
      std::allocator<char>::~allocator(&local_dc);
      std::allocator<char>::~allocator(&local_da);
      std::allocator<char>::~allocator(&local_d9);
      __cxa_atexit(__cxx_global_array_dtor_64,0,&__dso_handle);
      __cxa_guard_release(&init()::s_negativeTestTypes);
    }
  }
  for (test._4_4_ = 0; pTVar4 = sampler3dBindingTestGroup, test._4_4_ < 10;
      test._4_4_ = test._4_4_ + 1) {
    local_120 = init::s_renderTestTypes + test._4_4_;
    pSVar5 = (SamplerBindingRenderCase *)operator_new(0x120);
    local_141 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_140,"Sampler2D layout binding with ",&local_120->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::SamplerBindingRenderCase::SamplerBindingRenderCase
              (pSVar5,pCVar1,pcVar6,pcVar7,local_120->shaderType,local_120->testType,0x8b5e,0xde1);
    local_141 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pSVar5);
    std::__cxx11::string::~string((string *)&local_140);
    pTVar4 = imageBindingTestGroup;
    pSVar5 = (SamplerBindingRenderCase *)operator_new(0x120);
    local_169 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_168,"Sampler3D layout binding with ",&local_120->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::SamplerBindingRenderCase::SamplerBindingRenderCase
              (pSVar5,pCVar1,pcVar6,pcVar7,local_120->shaderType,local_120->testType,0x8b5f,0x806f);
    local_169 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pSVar5);
    std::__cxx11::string::~string((string *)&local_168);
    pTVar4 = image3dBindingTestGroup;
    pIVar8 = (ImageBindingRenderCase *)operator_new(0x120);
    local_191 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_190,"Image2D layout binding with ",&local_120->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingRenderCase::ImageBindingRenderCase
              (pIVar8,pCVar1,pcVar6,pcVar7,local_120->shaderType,local_120->testType,0x904d,0xde1);
    local_191 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pIVar8);
    std::__cxx11::string::~string((string *)&local_190);
    pTVar4 = UBOBindingTestGroup;
    pIVar8 = (ImageBindingRenderCase *)operator_new(0x120);
    local_1b9 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_1b8,"Image3D layout binding with ",&local_120->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingRenderCase::ImageBindingRenderCase
              (pIVar8,pCVar1,pcVar6,pcVar7,local_120->shaderType,local_120->testType,0x904e,0x806f);
    local_1b9 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pIVar8);
    std::__cxx11::string::~string((string *)&local_1b8);
    pTVar4 = SSBOBindingTestGroup;
    this_00 = (UBOBindingRenderCase *)operator_new(0x118);
    local_1e1 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_1e0,"UBO layout binding with ",&local_120->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::UBOBindingRenderCase::UBOBindingRenderCase
              (this_00,pCVar1,pcVar6,pcVar7,local_120->shaderType,local_120->testType);
    local_1e1 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_1e0);
    pTVar4 = negativeBindingTestGroup;
    this_01 = (SSBOBindingRenderCase *)operator_new(0x118);
    test_1._7_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&testNdx_1,
                   "SSBO layout binding with ",&local_120->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::SSBOBindingRenderCase::SSBOBindingRenderCase
              (this_01,pCVar1,pcVar6,pcVar7,local_120->shaderType,local_120->testType);
    test_1._7_1_ = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)&testNdx_1);
  }
  for (test_1._0_4_ = 0; pTVar4 = negativeSampler3dBindingTestGroup, (int)test_1 < 0x12;
      test_1._0_4_ = (int)test_1 + 1) {
    local_218 = init::s_negativeTestTypes + (int)test_1;
    pTVar3 = (TestNode *)operator_new(0x138);
    local_239 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_238,"Invalid sampler2d layout binding using ",&local_218->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::SamplerBindingNegativeCase::SamplerBindingNegativeCase
              ((SamplerBindingNegativeCase *)pTVar3,pCVar1,pcVar6,pcVar7,local_218->shaderType,
               local_218->testType,local_218->errorType,0x8b5e);
    local_239 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,pTVar3);
    std::__cxx11::string::~string((string *)&local_238);
    pTVar4 = negativeImageBindingTestGroup;
    pTVar3 = (TestNode *)operator_new(0x138);
    local_261 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_260,"Invalid sampler3d layout binding using ",&local_218->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::SamplerBindingNegativeCase::SamplerBindingNegativeCase
              ((SamplerBindingNegativeCase *)pTVar3,pCVar1,pcVar6,pcVar7,local_218->shaderType,
               local_218->testType,local_218->errorType,0x8b5f);
    local_261 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,pTVar3);
    std::__cxx11::string::~string((string *)&local_260);
    pTVar4 = negativeImage3dBindingTestGroup;
    pTVar3 = (TestNode *)operator_new(0x138);
    local_289 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_288,"Invalid image2d layout binding using ",&local_218->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingNegativeCase::ImageBindingNegativeCase
              ((ImageBindingNegativeCase *)pTVar3,pCVar1,pcVar6,pcVar7,local_218->shaderType,
               local_218->testType,local_218->errorType,0x904d);
    local_289 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,pTVar3);
    std::__cxx11::string::~string((string *)&local_288);
    pTVar4 = negativeUBOBindingTestGroup;
    pTVar3 = (TestNode *)operator_new(0x138);
    local_2b1 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_2b0,"Invalid image3d layout binding using ",&local_218->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImageBindingNegativeCase::ImageBindingNegativeCase
              ((ImageBindingNegativeCase *)pTVar3,pCVar1,pcVar6,pcVar7,local_218->shaderType,
               local_218->testType,local_218->errorType,0x904e);
    local_2b1 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,pTVar3);
    std::__cxx11::string::~string((string *)&local_2b0);
    pTVar4 = negativeSSBOBindingTestGroup;
    pTVar3 = (TestNode *)operator_new(0x138);
    local_2d9 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_2d8,"Invalid UBO layout binding using ",&local_218->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::UBOBindingNegativeCase::UBOBindingNegativeCase
              ((UBOBindingNegativeCase *)pTVar3,pCVar1,pcVar6,pcVar7,local_218->shaderType,
               local_218->testType,local_218->errorType);
    local_2d9 = 0;
    tcu::TestNode::addChild(&pTVar4->super_TestNode,pTVar3);
    std::__cxx11::string::~string((string *)&local_2d8);
    pTVar3 = local_a8;
    node = (TestNode *)operator_new(0x138);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_300,"Invalid SSBO layout binding using ",&local_218->descPostfix);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::SSBOBindingNegativeCase::SSBOBindingNegativeCase
              ((SSBOBindingNegativeCase *)node,pCVar1,pcVar6,pcVar7,local_218->shaderType,
               local_218->testType,local_218->errorType);
    tcu::TestNode::addChild(pTVar3,node);
    std::__cxx11::string::~string((string *)&local_300);
  }
  tcu::TestNode::addChild(local_18,&sampler3dBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild(local_18,&imageBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&image2dBindingTestGroup->super_TestNode,&image3dBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&image2dBindingTestGroup->super_TestNode,&UBOBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&negativeSampler2dBindingTestGroup->super_TestNode,
             &negativeSampler3dBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&negativeSampler2dBindingTestGroup->super_TestNode,
             &negativeImageBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&negativeImage2dBindingTestGroup->super_TestNode,
             &negativeImage3dBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&negativeImage2dBindingTestGroup->super_TestNode,
             &negativeUBOBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&negativeSamplerBindingTestGroup->super_TestNode,
             &negativeSampler2dBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&negativeSamplerBindingTestGroup->super_TestNode,
             &negativeSSBOBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild(&negativeSamplerBindingTestGroup->super_TestNode,local_a8);
  tcu::TestNode::addChild
            (&negativeSamplerBindingTestGroup->super_TestNode,
             &negativeImage2dBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,local_18);
  tcu::TestNode::addChild((TestNode *)this,&SSBOBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&negativeBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&image2dBindingTestGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,&negativeSamplerBindingTestGroup->super_TestNode);
  return extraout_EAX;
}

Assistant:

void LayoutBindingTests::init (void)
{
	// Render test groups
	tcu::TestCaseGroup* const samplerBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "sampler",		"Test sampler layout binding");
	tcu::TestCaseGroup* const sampler2dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "sampler2d",	"Test sampler2d layout binding");
	tcu::TestCaseGroup* const sampler3dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "sampler3d",	"Test sampler3d layout binding");

	tcu::TestCaseGroup* const imageBindingTestGroup				= new tcu::TestCaseGroup(m_testCtx, "image",		"Test image layout binding");
	tcu::TestCaseGroup* const image2dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "image2d",		"Test image2d layout binding");
	tcu::TestCaseGroup* const image3dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "image3d",		"Test image3d layout binding");

	tcu::TestCaseGroup* const UBOBindingTestGroup				= new tcu::TestCaseGroup(m_testCtx, "ubo",			"Test UBO layout binding");
	tcu::TestCaseGroup* const SSBOBindingTestGroup				= new tcu::TestCaseGroup(m_testCtx, "ssbo",			"Test SSBO layout binding");

	// Negative test groups
	tcu::TestCaseGroup* const negativeBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "negative",		"Test layout binding with invalid bindings");

	tcu::TestCaseGroup* const negativeSamplerBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "sampler",		"Test sampler layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeSampler2dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "sampler2d",	"Test sampler2d layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeSampler3dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "sampler3d",	"Test sampler3d layout binding with invalid bindings");

	tcu::TestCaseGroup* const negativeImageBindingTestGroup		= new tcu::TestCaseGroup(m_testCtx, "image",		"Test image layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeImage2dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "image2d",		"Test image2d layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeImage3dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "image3d",		"Test image3d layout binding with invalid bindings");

	tcu::TestCaseGroup* const negativeUBOBindingTestGroup		= new tcu::TestCaseGroup(m_testCtx, "ubo",			"Test UBO layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeSSBOBindingTestGroup		= new tcu::TestCaseGroup(m_testCtx, "ssbo",			"Test SSBO layout binding with invalid bindings");

	static const struct RenderTestType
	{
		ShaderType				shaderType;
		TestType				testType;
		std::string				name;
		std::string				descPostfix;
	} s_renderTestTypes[] =
	{
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_SINGLE,		"vertex_binding_single",		"a single instance" },
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_MAX,			"vertex_binding_max",			"maximum binding point"	},
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_MULTIPLE,		"vertex_binding_multiple",		"multiple instances"},
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_ARRAY,			"vertex_binding_array",			"an array instance" },
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_MAX_ARRAY,		"vertex_binding_max_array",		"an array instance with maximum binding point" },

		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_SINGLE,		"fragment_binding_single",		"a single instance" },
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_MAX,			"fragment_binding_max",			"maximum binding point"	},
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_MULTIPLE,		"fragment_binding_multiple",	"multiple instances"},
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_ARRAY,			"fragment_binding_array",		"an array instance" },
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_MAX_ARRAY,		"fragment_binding_max_array",	"an array instance with maximum binding point" },
	};

	static const struct NegativeTestType
	{
		ShaderType								shaderType;
		TestType								testType;
		LayoutBindingNegativeCase::ErrorType	errorType;
		std::string								name;
		std::string								descPostfix;
	} s_negativeTestTypes[] =
	{
		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"vertex_binding_over_max",					"over maximum binding point"   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"fragment_binding_over_max",				"over maximum binding point"   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_control_binding_over_max",			"over maximum binding point"   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_evaluation_binding_over_max",			"over maximum binding point"   },
		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"vertex_binding_neg",						"negative binding point"	   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"fragment_binding_neg",						"negative binding point"	   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_control_binding_neg",					"negative binding point"	   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_evaluation_binding_neg",				"negative binding point"	   },

		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"vertex_binding_over_max_array",			"over maximum binding point"   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"fragment_binding_over_max_array",			"over maximum binding point"   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_control_binding_over_max_array",		"over maximum binding point"   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_evaluation_binding_over_max_array",	"over maximum binding point"   },
		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"vertex_binding_neg_array",					"negative binding point"	   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"fragment_binding_neg_array",				"negative binding point"	   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_control_binding_neg_array",			"negative binding point"	   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_evaluation_binding_neg_array",		"negative binding point"	   },

		{ SHADERTYPE_ALL,				TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_CONTRADICTORY,		"binding_contradictory",					"contradictory binding points" },
		{ SHADERTYPE_ALL,				TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_CONTRADICTORY,		"binding_contradictory_array",				"contradictory binding points" },
	};

	// Render tests
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_renderTestTypes); ++testNdx)
	{
		const RenderTestType& test = s_renderTestTypes[testNdx];

		// Render sampler binding tests
		sampler2dBindingTestGroup->addChild(new SamplerBindingRenderCase(m_context, test.name.c_str(), ("Sampler2D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_SAMPLER_2D, GL_TEXTURE_2D));
		sampler3dBindingTestGroup->addChild(new SamplerBindingRenderCase(m_context, test.name.c_str(), ("Sampler3D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_SAMPLER_3D, GL_TEXTURE_3D));

		// Render image binding tests
		image2dBindingTestGroup->addChild(new ImageBindingRenderCase(m_context, test.name.c_str(), ("Image2D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_IMAGE_2D, GL_TEXTURE_2D));
		image3dBindingTestGroup->addChild(new ImageBindingRenderCase(m_context, test.name.c_str(), ("Image3D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_IMAGE_3D, GL_TEXTURE_3D));

		// Render UBO binding tests
		UBOBindingTestGroup->addChild(new UBOBindingRenderCase(m_context, test.name.c_str(), ("UBO layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType));

		// Render SSBO binding tests
		SSBOBindingTestGroup->addChild(new SSBOBindingRenderCase(m_context, test.name.c_str(), ("SSBO layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType));
	}

	// Negative binding tests
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_negativeTestTypes); ++testNdx)
	{
		const NegativeTestType& test = s_negativeTestTypes[testNdx];

		// Negative sampler binding tests
		negativeSampler2dBindingTestGroup->addChild(new SamplerBindingNegativeCase(m_context, test.name.c_str(), ("Invalid sampler2d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_SAMPLER_2D));
		negativeSampler3dBindingTestGroup->addChild(new SamplerBindingNegativeCase(m_context, test.name.c_str(), ("Invalid sampler3d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_SAMPLER_3D));

		// Negative image binding tests
		negativeImage2dBindingTestGroup->addChild(new ImageBindingNegativeCase(m_context, test.name.c_str(), ("Invalid image2d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_IMAGE_2D));
		negativeImage3dBindingTestGroup->addChild(new ImageBindingNegativeCase(m_context, test.name.c_str(), ("Invalid image3d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_IMAGE_3D));

		// Negative UBO binding tests
		negativeUBOBindingTestGroup->addChild(new UBOBindingNegativeCase(m_context, test.name.c_str(), ("Invalid UBO layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType));

		// Negative SSBO binding tests
		negativeSSBOBindingTestGroup->addChild(new SSBOBindingNegativeCase(m_context, test.name.c_str(), ("Invalid SSBO layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType));
	}

	samplerBindingTestGroup->addChild(sampler2dBindingTestGroup);
	samplerBindingTestGroup->addChild(sampler3dBindingTestGroup);

	imageBindingTestGroup->addChild(image2dBindingTestGroup);
	imageBindingTestGroup->addChild(image3dBindingTestGroup);

	negativeSamplerBindingTestGroup->addChild(negativeSampler2dBindingTestGroup);
	negativeSamplerBindingTestGroup->addChild(negativeSampler3dBindingTestGroup);

	negativeImageBindingTestGroup->addChild(negativeImage2dBindingTestGroup);
	negativeImageBindingTestGroup->addChild(negativeImage3dBindingTestGroup);

	negativeBindingTestGroup->addChild(negativeSamplerBindingTestGroup);
	negativeBindingTestGroup->addChild(negativeUBOBindingTestGroup);
	negativeBindingTestGroup->addChild(negativeSSBOBindingTestGroup);
	negativeBindingTestGroup->addChild(negativeImageBindingTestGroup);

	addChild(samplerBindingTestGroup);
	addChild(UBOBindingTestGroup);
	addChild(SSBOBindingTestGroup);
	addChild(imageBindingTestGroup);
	addChild(negativeBindingTestGroup);
}